

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.h
# Opt level: O2

Index wasm::Properties::getSignExtBits(Expression *curr)

{
  Index IVar1;
  Binary *pBVar2;
  
  if ((curr->type).id != 2) {
    __assert_fail("curr->type == Type::i32",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/properties.h"
                  ,0xb3,"Index wasm::Properties::getSignExtBits(Expression *)");
  }
  if (curr->_id == UnaryId) {
    if (*(int *)(curr + 1) == 0x2f) {
      IVar1 = 8;
    }
    else {
      if (*(int *)(curr + 1) != 0x30) {
        handle_unreachable("invalid unary operation",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/properties.h"
                           ,0xbb);
      }
      IVar1 = 0x10;
    }
  }
  else {
    pBVar2 = Expression::cast<wasm::Binary>(curr);
    IVar1 = Bits::getEffectiveShifts(pBVar2->right);
    IVar1 = 0x20 - IVar1;
  }
  return IVar1;
}

Assistant:

inline Index getSignExtBits(Expression* curr) {
  assert(curr->type == Type::i32);
  if (auto* unary = curr->dynCast<Unary>()) {
    switch (unary->op) {
      case ExtendS8Int32:
        return 8;
      case ExtendS16Int32:
        return 16;
      default:
        WASM_UNREACHABLE("invalid unary operation");
    }
  } else {
    auto* rightShift = curr->cast<Binary>()->right;
    return 32 - Bits::getEffectiveShifts(rightShift);
  }
}